

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

void __thiscall
jbcoin::STObject::STObject(STObject *this,SOTemplate *type,SerialIter *sit,SField *name)

{
  atomic<int> *paVar1;
  Counter *pCVar2;
  int depth;
  
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d3040;
  (this->super_STBase).fName = name;
  pCVar2 = CountedObject<jbcoin::STObject>::getCounter();
  LOCK();
  paVar1 = &(pCVar2->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STObject_002d31a0;
  (this->v_).super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_).super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_).super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::reserve
            (&this->v_,
             (long)(type->mTypes).
                   super__Vector_base<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>,_std::allocator<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(type->mTypes).
                   super__Vector_base<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>,_std::allocator<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  set(this,sit,depth);
  setType(this,type);
  return;
}

Assistant:

STObject::STObject (SOTemplate const& type,
        SerialIter & sit, SField const& name)
    : STBase (name)
{
    v_.reserve(type.size());
    set (sit);
    setType (type);
}